

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Search_Digits_RE2(int i)

{
  int i_local;
  
  SearchDigits(i,SearchRE2);
  return;
}

Assistant:

void Search_Digits_RE2(int i)         { SearchDigits(i, SearchRE2); }